

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

ON_AngleValue *
ON_AngleValue::CreateFromSubString
          (ON_AngleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  ON_wString *this;
  ON_ParseSettings parse_settings_00;
  StringFormat SVar1;
  undefined1 uVar2;
  double dVar3;
  AngleUnitSystem AVar4;
  LengthUnitSystem LVar5;
  uint length;
  uint uVar6;
  char *sFormat;
  int line_number;
  AngleUnitSystem string_angle_unit_system;
  double angle_value;
  ON_ParseSettings parse_results;
  AngleUnitSystem local_69;
  ON_wString local_68;
  double local_60;
  double local_58;
  ON_ParseSettings local_50;
  
  if (string_end != (wchar_t **)0x0) {
    *string_end = string;
  }
  if (string_count < -1) {
    sFormat = "Invalid string_count parameter.";
    line_number = 0x38a;
  }
  else {
    if ((string_count == 0 || string == (wchar_t *)0x0) || (*string == L'\0')) goto LAB_005c0cd7;
    local_58 = ON_DBL_QNAN;
    local_60 = ON_DBL_QNAN;
    ON_ParseSettings::ON_ParseSettings(&local_50);
    local_69 = Unset;
    parse_settings_00.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = parse_settings.m_reserved;
    length = ON_ParseAngleExpression
                       (string,string_count,parse_settings_00,&local_60,&local_50,&local_69);
    if ((0 < (int)length) &&
       ((string_count == -1 || (int)length <= string_count && (!NAN(local_60))))) {
      __return_storage_ptr__->m_context_locale_id = 0;
      __return_storage_ptr__->m_context_length_unit_system = None;
      __return_storage_ptr__->m_string_format = ExactDecimal;
      __return_storage_ptr__->m_angle_unit_system = Unset;
      __return_storage_ptr__->m_angle = local_58;
      this = &__return_storage_ptr__->m_angle_as_string;
      ON_wString::ON_wString(this);
      __return_storage_ptr__->m_angle = local_60;
      AVar4 = local_69;
      if (0xfd < (byte)(local_69 - Turns)) {
        AVar4 = ON_ParseSettings::DefaultAngleUnitSystem(&parse_settings);
      }
      __return_storage_ptr__->m_angle_unit_system = AVar4;
      LVar5 = ON_ParseSettings::ContextLengthUnitSystem(&parse_settings);
      __return_storage_ptr__->m_context_length_unit_system = LVar5;
      uVar6 = ON_ParseSettings::ContextLocaleId(&parse_settings);
      __return_storage_ptr__->m_context_locale_id = uVar6;
      ON_wString::ON_wString(&local_68,string,length);
      ON_wString::operator=(this,&local_68);
      ON_wString::~ON_wString(&local_68);
      ON_wString::TrimLeftAndRight(this,(wchar_t *)0x0);
      if (string_end == (wchar_t **)0x0) {
        return __return_storage_ptr__;
      }
      *string_end = string + length;
      return __return_storage_ptr__;
    }
    sFormat = "Input string parameter is not valid.";
    line_number = 0x3a6;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
             ,line_number,"",sFormat);
LAB_005c0cd7:
  dVar3 = Unset.m_angle;
  LVar5 = Unset.m_context_length_unit_system;
  SVar1 = Unset.m_string_format;
  AVar4 = Unset.m_angle_unit_system;
  uVar2 = Unset._7_1_;
  __return_storage_ptr__->m_context_locale_id = Unset.m_context_locale_id;
  __return_storage_ptr__->m_context_length_unit_system = LVar5;
  __return_storage_ptr__->m_string_format = SVar1;
  __return_storage_ptr__->m_angle_unit_system = AVar4;
  __return_storage_ptr__->field_0x7 = uVar2;
  __return_storage_ptr__->m_angle = dVar3;
  ON_wString::ON_wString(&__return_storage_ptr__->m_angle_as_string,&Unset.m_angle_as_string);
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::CreateFromSubString(
  ON_ParseSettings parse_settings,
  const wchar_t* string,
  int string_count,
  const wchar_t** string_end
  )
{
  // All calls to some version of ON_AngleValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_AngleValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_AngleValue::Unset;
  }
  
  double angle_value = ON_DBL_QNAN;
  ON_ParseSettings parse_results;
  ON::AngleUnitSystem string_angle_unit_system = ON::AngleUnitSystem::Unset;
  const int parse_count = ON_ParseAngleExpression(
    string,
    string_count,
    parse_settings, 
    &angle_value,
    &parse_results,
    &string_angle_unit_system
  );

  if ( parse_count <= 0 
    || (parse_count > string_count && string_count >= 0)
    || false == (angle_value == angle_value) 
    ) 
  {
    // non-empty string failure generates debugger error.
    ON_ERROR("Input string parameter is not valid.");
    return ON_AngleValue::Unset;
  }

  ON_AngleValue rc;

  rc.m_angle = angle_value;

  if (ON::AngleUnitSystem::Unset != string_angle_unit_system && ON::AngleUnitSystem::None != string_angle_unit_system)
    rc.m_angle_unit_system = string_angle_unit_system;
  else
    rc.m_angle_unit_system = parse_settings.DefaultAngleUnitSystem();

  rc.m_context_length_unit_system = parse_settings.ContextLengthUnitSystem();
  rc.m_context_locale_id = parse_settings.ContextLocaleId();

  rc.m_angle_as_string = ON_wString(string, parse_count);
  rc.m_angle_as_string.TrimLeftAndRight();
  
  if (nullptr != string_end)
    *string_end = string + parse_count;

  return rc;
}